

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhysicalDevice.cpp
# Opt level: O3

void __thiscall
myvk::PhysicalDevice::PhysicalDevice
          (PhysicalDevice *this,Ptr<Instance> *instance,VkPhysicalDevice physical_device)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Rb_tree_header *p_Var1;
  pointer __src;
  mapped_type_conflict mVar2;
  PhysicalDeviceProperties *pPVar3;
  pointer pVVar4;
  vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> *this_01;
  size_t sVar5;
  mapped_type_conflict *pmVar6;
  pointer __s;
  uint32_t count_1;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> extensions;
  VkPhysicalDeviceFeatures2 features2;
  uint local_3bc;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> local_3b8;
  vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> *local_398;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *local_390;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_388;
  VkPhysicalDeviceMemoryProperties *local_380;
  undefined1 local_378 [840];
  
  (this->super_Base).super_enable_shared_from_this<myvk::Base>._M_weak_this.
  super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_Base).super_enable_shared_from_this<myvk::Base>._M_weak_this.
  super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Base)._vptr_Base = (_func_int **)&PTR__PhysicalDevice_0032c470;
  local_380 = &this->m_memory_properties;
  memset(&this->m_instance_ptr,0,0x2fc);
  (this->m_features).vk11.sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_1_FEATURES;
  (this->m_features).vk11.pNext = &(this->m_features).vk12;
  (this->m_features).vk11.storageBuffer16BitAccess = 0;
  (this->m_features).vk11.uniformAndStorageBuffer16BitAccess = 0;
  (this->m_features).vk11.storagePushConstant16 = 0;
  (this->m_features).vk11.storageInputOutput16 = 0;
  (this->m_features).vk11.multiview = 0;
  (this->m_features).vk11.multiviewGeometryShader = 0;
  (this->m_features).vk11.multiviewTessellationShader = 0;
  (this->m_features).vk11.variablePointersStorageBuffer = 0;
  (this->m_features).vk11.variablePointers = 0;
  (this->m_features).vk11.protectedMemory = 0;
  (this->m_features).vk11.samplerYcbcrConversion = 0;
  (this->m_features).vk11.shaderDrawParameters = 0;
  (this->m_features).vk12.sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_2_FEATURES;
  (this->m_features).vk12.pNext = &(this->m_features).vk13;
  memset(&(this->m_features).vk12.samplerMirrorClampToEdge,0,0xbc);
  (this->m_features).vk13.sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_3_FEATURES;
  (this->m_features).vk13.pNext = (void *)0x0;
  (this->m_features).vk13.robustImageAccess = 0;
  (this->m_features).vk13.inlineUniformBlock = 0;
  (this->m_features).vk13.descriptorBindingInlineUniformBlockUpdateAfterBind = 0;
  (this->m_features).vk13.pipelineCreationCacheControl = 0;
  (this->m_features).vk13.privateData = 0;
  (this->m_features).vk13.shaderDemoteToHelperInvocation = 0;
  (this->m_features).vk13.shaderTerminateInvocation = 0;
  (this->m_features).vk13.subgroupSizeControl = 0;
  (this->m_features).vk13.computeFullSubgroups = 0;
  (this->m_features).vk13.synchronization2 = 0;
  (this->m_features).vk13.textureCompressionASTC_HDR = 0;
  (this->m_features).vk13.shaderZeroInitializeWorkgroupMemory = 0;
  (this->m_features).vk13.dynamicRendering = 0;
  (this->m_features).vk13.shaderIntegerDotProduct = 0;
  (this->m_features).vk13.maintenance4 = 0;
  memset(&this->m_properties,0,0x124);
  memset(&(this->m_properties).vk10.limits,0,0x20c);
  (this->m_properties).vk11.sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_1_PROPERTIES;
  (this->m_properties).vk11.pNext = &(this->m_properties).vk12;
  (this->m_properties).vk11.maxMemoryAllocationSize = 0;
  (this->m_properties).vk11.deviceUUID[0] = '\0';
  (this->m_properties).vk11.deviceUUID[1] = '\0';
  (this->m_properties).vk11.deviceUUID[2] = '\0';
  (this->m_properties).vk11.deviceUUID[3] = '\0';
  (this->m_properties).vk11.deviceUUID[4] = '\0';
  (this->m_properties).vk11.deviceUUID[5] = '\0';
  (this->m_properties).vk11.deviceUUID[6] = '\0';
  (this->m_properties).vk11.deviceUUID[7] = '\0';
  pPVar3 = &this->m_properties;
  (pPVar3->vk11).deviceUUID[8] = '\0';
  (pPVar3->vk11).deviceUUID[9] = '\0';
  (pPVar3->vk11).deviceUUID[10] = '\0';
  (pPVar3->vk11).deviceUUID[0xb] = '\0';
  (pPVar3->vk11).deviceUUID[0xc] = '\0';
  (pPVar3->vk11).deviceUUID[0xd] = '\0';
  (pPVar3->vk11).deviceUUID[0xe] = '\0';
  (pPVar3->vk11).deviceUUID[0xf] = '\0';
  (this->m_properties).vk11.driverUUID[0] = '\0';
  (this->m_properties).vk11.driverUUID[1] = '\0';
  (this->m_properties).vk11.driverUUID[2] = '\0';
  (this->m_properties).vk11.driverUUID[3] = '\0';
  (this->m_properties).vk11.driverUUID[4] = '\0';
  (this->m_properties).vk11.driverUUID[5] = '\0';
  (this->m_properties).vk11.driverUUID[6] = '\0';
  (this->m_properties).vk11.driverUUID[7] = '\0';
  pPVar3 = &this->m_properties;
  (pPVar3->vk11).driverUUID[8] = '\0';
  (pPVar3->vk11).driverUUID[9] = '\0';
  (pPVar3->vk11).driverUUID[10] = '\0';
  (pPVar3->vk11).driverUUID[0xb] = '\0';
  (pPVar3->vk11).driverUUID[0xc] = '\0';
  (pPVar3->vk11).driverUUID[0xd] = '\0';
  (pPVar3->vk11).driverUUID[0xe] = '\0';
  (pPVar3->vk11).driverUUID[0xf] = '\0';
  (this->m_properties).vk11.deviceLUID[0] = '\0';
  (this->m_properties).vk11.deviceLUID[1] = '\0';
  (this->m_properties).vk11.deviceLUID[2] = '\0';
  (this->m_properties).vk11.deviceLUID[3] = '\0';
  (this->m_properties).vk11.deviceLUID[4] = '\0';
  (this->m_properties).vk11.deviceLUID[5] = '\0';
  (this->m_properties).vk11.deviceLUID[6] = '\0';
  (this->m_properties).vk11.deviceLUID[7] = '\0';
  (this->m_properties).vk11.deviceNodeMask = 0;
  (this->m_properties).vk11.deviceLUIDValid = 0;
  (this->m_properties).vk11.subgroupSize = 0;
  (this->m_properties).vk11.subgroupSupportedStages = 0;
  (this->m_properties).vk11.subgroupSupportedOperations = 0;
  (this->m_properties).vk11.subgroupQuadOperationsInAllStages = 0;
  (this->m_properties).vk11.pointClippingBehavior = VK_POINT_CLIPPING_BEHAVIOR_ALL_CLIP_PLANES;
  (this->m_properties).vk11.maxMultiviewViewCount = 0;
  (this->m_properties).vk11.maxMultiviewInstanceIndex = 0;
  (this->m_properties).vk11.protectedNoFault = 0;
  (this->m_properties).vk11.maxPerSetDescriptors = 0;
  (this->m_properties).vk12.sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_2_PROPERTIES;
  (this->m_properties).vk12.pNext = &(this->m_properties).vk13;
  memset(&(this->m_properties).vk12.driverID,0,0x2cc);
  (this->m_properties).vk13.sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_3_PROPERTIES;
  (this->m_properties).vk13.uniformTexelBufferOffsetAlignmentBytes = 0;
  (this->m_properties).vk13.uniformTexelBufferOffsetSingleTexelAlignment = 0;
  memset(&(this->m_properties).vk13.pNext,0,0xb4);
  local_398 = &this->m_queue_family_properties;
  local_390 = &this->m_extensions;
  p_Var1 = &(this->m_extensions)._M_t._M_impl.super__Rb_tree_header;
  (this->m_extensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_extensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_properties).vk13.maxBufferSize = 0;
  (this->m_queue_family_properties).
  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_queue_family_properties).
  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_queue_family_properties).
  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_extensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_extensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_extensions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_instance_ptr).super___shared_ptr<myvk::Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (instance->super___shared_ptr<myvk::Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this_00 = &(this->m_instance_ptr).super___shared_ptr<myvk::Instance,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (this_00,&(instance->super___shared_ptr<myvk::Instance,_(__gnu_cxx::_Lock_policy)2>).
                      _M_refcount);
  this->m_physical_device = physical_device;
  local_388 = this_00;
  (*vkGetPhysicalDeviceMemoryProperties)(physical_device,local_380);
  memset((VkPhysicalDeviceFeatures2 *)local_378,0,0xf0);
  local_378._0_4_ = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2;
  local_378._8_8_ = &(this->m_features).vk11;
  (*vkGetPhysicalDeviceFeatures2)(physical_device,(VkPhysicalDeviceFeatures2 *)local_378);
  memcpy(&this->m_features,local_378 + 0x10,0xdc);
  memset((VkPhysicalDeviceProperties2 *)local_378,0,0x348);
  local_378._0_4_ = 0x3b9bb079;
  local_378._8_8_ = &(this->m_properties).vk11;
  (*vkGetPhysicalDeviceProperties2)(physical_device,(VkPhysicalDeviceProperties2 *)local_378);
  __src = local_378 + 0x10;
  memcpy(&this->m_properties,__src,0x338);
  this_01 = local_398;
  (*vkGetPhysicalDeviceQueueFamilyProperties)
            (physical_device,(uint32_t *)local_378,(VkQueueFamilyProperties *)0x0);
  std::vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>::resize
            (this_01,local_378._0_8_ & 0xffffffff);
  (*vkGetPhysicalDeviceQueueFamilyProperties)
            (physical_device,(uint32_t *)local_378,
             (this_01->
             super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>).
             _M_impl.super__Vector_impl_data._M_start);
  local_3b8.super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
  _M_impl.super__Vector_impl_data._M_start = (VkExtensionProperties *)0x0;
  local_3b8.super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
  _M_impl.super__Vector_impl_data._M_finish = (VkExtensionProperties *)0x0;
  local_3b8.super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*vkEnumerateDeviceExtensionProperties)
            (physical_device,(char *)0x0,&local_3bc,(VkExtensionProperties *)0x0);
  std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::resize
            (&local_3b8,(ulong)local_3bc);
  (*vkEnumerateDeviceExtensionProperties)
            (physical_device,(char *)0x0,&local_3bc,
             local_3b8.
             super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
             _M_impl.super__Vector_impl_data._M_start);
  pVVar4 = local_3b8.
           super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (local_3b8.super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_3b8.super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    __s = local_3b8.
          super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
          super__Vector_impl_data._M_start;
    do {
      mVar2 = __s->specVersion;
      local_378._0_8_ = __src;
      sVar5 = strlen(__s->extensionName);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_378,__s,__s->extensionName + sVar5);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::operator[](local_390,(key_type *)local_378);
      *pmVar6 = mVar2;
      if ((pointer)local_378._0_8_ != __src) {
        operator_delete((void *)local_378._0_8_,local_378._16_8_ + 1);
      }
      __s = __s + 1;
    } while (__s != pVVar4);
  }
  if (local_3b8.super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
      _M_impl.super__Vector_impl_data._M_start != (VkExtensionProperties *)0x0) {
    operator_delete(local_3b8.
                    super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_3b8.
                          super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3b8.
                          super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

PhysicalDevice::PhysicalDevice(const Ptr<Instance> &instance, VkPhysicalDevice physical_device) {
	m_instance_ptr = instance;
	m_physical_device = physical_device;
	vkGetPhysicalDeviceMemoryProperties(physical_device, &m_memory_properties);
	{
		VkPhysicalDeviceFeatures2 features2{VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2, &m_features.vk11};
		vkGetPhysicalDeviceFeatures2(physical_device, &features2);
		m_features.vk10 = features2.features;
	}
	{
		VkPhysicalDeviceProperties2 properties2{VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PROPERTIES_2, &m_properties.vk11};
		vkGetPhysicalDeviceProperties2(physical_device, &properties2);
		m_properties.vk10 = properties2.properties;
	}
	{
		uint32_t count;
		vkGetPhysicalDeviceQueueFamilyProperties(physical_device, &count, nullptr);
		m_queue_family_properties.resize(count);
		vkGetPhysicalDeviceQueueFamilyProperties(physical_device, &count, m_queue_family_properties.data());
	}
	{
		uint32_t count;
		std::vector<VkExtensionProperties> extensions;
		vkEnumerateDeviceExtensionProperties(physical_device, nullptr, &count, nullptr);
		extensions.resize(count);
		vkEnumerateDeviceExtensionProperties(physical_device, nullptr, &count, extensions.data());
		for (const auto &e : extensions)
			m_extensions[e.extensionName] = e.specVersion;
	}
}